

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>
::operator=(SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>
            *this,SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>
                  *RHS)

{
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *pIVar1;
  undefined1 *puVar2;
  ulong uVar3;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *pIVar4;
  ulong MinSize;
  ulong uVar5;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *pIVar6;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *__result;
  
  if (this != RHS) {
    pIVar6 = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
              *)(RHS->
                super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
                ).
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                .super_SmallVectorBase.BeginX;
    pIVar1 = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
              *)(RHS->
                super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
                ).
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                .super_SmallVectorBase.EndX;
    uVar3 = (long)pIVar1 - (long)pIVar6;
    MinSize = ((long)uVar3 >> 3) * -0x7063e7063e7063e7;
    __result = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                *)(this->
                  super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
                  ).
                  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                  .super_SmallVectorBase.BeginX;
    pIVar4 = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
              *)(this->
                super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
                ).
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                .super_SmallVectorBase.EndX;
    uVar5 = ((long)pIVar4 - (long)__result >> 3) * -0x7063e7063e7063e7;
    if (uVar5 < MinSize) {
      if ((ulong)((long)(this->
                        super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
                        ).
                        super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                        .super_SmallVectorBase.CapacityX - (long)__result) < uVar3) {
        for (; pIVar4 != __result; pIVar4 = pIVar4 + -1) {
          puVar2 = (undefined1 *)
                   pIVar4[-1].
                   super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                   .unparsed.
                   super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
                   .
                   super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
                   .
                   super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
                   .super_SmallVectorBase.BeginX;
          if (&pIVar4[-1].
               super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
               .unparsed.
               super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
               .
               super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
               .
               super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
               .FirstEl != (U *)puVar2) {
            free(puVar2);
          }
        }
        (this->
        super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
        ).
        super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
        .super_SmallVectorBase.EndX =
             (this->
             super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
             .super_SmallVectorBase.BeginX;
        SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
        ::grow(&this->
                super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
               ,MinSize);
        uVar5 = 0;
      }
      else if (pIVar4 == __result) {
        uVar5 = 0;
      }
      else {
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>const*,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>*>
                  (pIVar6,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                           *)(((long)pIVar4 - (long)__result) + (long)pIVar6),__result);
      }
      std::__uninitialized_copy<false>::
      __uninit_copy<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>const*,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>*>
                ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                  *)((long)(RHS->
                           super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
                           ).
                           super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                           .super_SmallVectorBase.BeginX + uVar5 * 0x148),
                 (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                  *)(RHS->
                    super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                    .super_SmallVectorBase.EndX,
                 (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                  *)(uVar5 * 0x148 +
                    (long)(this->
                          super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
                          ).
                          super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                          .super_SmallVectorBase.BeginX));
      __result = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                  *)(uVar3 + (long)(this->
                                   super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
                                   ).
                                   super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                                   .super_SmallVectorBase.BeginX);
    }
    else {
      if (pIVar1 != pIVar6) {
        __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>const*,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>*>
                             (pIVar6,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                                      *)(uVar3 + (long)pIVar6),__result);
      }
      for (pIVar6 = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                     *)(this->
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
                       ).
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                       .super_SmallVectorBase.EndX; pIVar6 != __result; pIVar6 = pIVar6 + -1) {
        puVar2 = (undefined1 *)
                 pIVar6[-1].
                 super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                 .unparsed.
                 super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
                 .
                 super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
                 .
                 super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
                 .super_SmallVectorBase.BeginX;
        if (&pIVar6[-1].
             super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
             .unparsed.
             super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
             .
             super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
             .
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
             .FirstEl != (U *)puVar2) {
          free(puVar2);
        }
      }
    }
    (this->
    super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<33U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
    .super_SmallVectorBase.EndX = __result;
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}